

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

int nch(parse *p,cset *cs)

{
  int local_2c;
  int n;
  size_t css;
  size_t i;
  cset *cs_local;
  parse *p_local;
  
  local_2c = 0;
  for (css = 0; css < (ulong)(long)p->g->csetsize; css = css + 1) {
    if ((cs->ptr[css & 0xff] & cs->mask) != 0) {
      local_2c = local_2c + 1;
    }
  }
  return local_2c;
}

Assistant:

static int
nch(p, cs)
struct parse *p;
cset *cs;
{
	size_t i;
	size_t css = (size_t)p->g->csetsize;
	int n = 0;

	for (i = 0; i < css; i++)
		if (CHIN(cs, i))
			n++;
	return(n);
}